

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O3

int __thiscall lzham::symbol_codec::decode_remove_byte_from_bit_buf(symbol_codec *this)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (7 < this->m_bit_count) {
    uVar1 = (uint)(byte)(this->m_bit_buf >> 0x38);
    this->m_bit_buf = this->m_bit_buf << 8;
    this->m_bit_count = this->m_bit_count + -8;
  }
  return uVar1;
}

Assistant:

int symbol_codec::decode_remove_byte_from_bit_buf()
   {
      if (m_bit_count < 8)
         return -1;
      int result = static_cast<int>(m_bit_buf >> (cBitBufSize - 8));
      m_bit_buf <<= 8;
      m_bit_count -= 8;
      return result;
   }